

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O3

int64_t __thiscall absl::lts_20240722::flags_internal::FlagImpl::ReadOneWord(FlagImpl *this)

{
  atomic<long> *paVar1;
  
  if ((this->field_0x28 & 4) == 0) {
    DataGuard(this);
    paVar1 = OneWordValue(this);
    return (paVar1->super___atomic_base<long>)._M_i;
  }
  __assert_fail("ValueStorageKind() == FlagValueStorageKind::kOneWordAtomic || ValueStorageKind() == FlagValueStorageKind::kValueAndInitBit"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/flags/internal/flag.cc"
                ,0x230,"int64_t absl::flags_internal::FlagImpl::ReadOneWord() const");
}

Assistant:

int64_t FlagImpl::ReadOneWord() const {
  assert(ValueStorageKind() == FlagValueStorageKind::kOneWordAtomic ||
         ValueStorageKind() == FlagValueStorageKind::kValueAndInitBit);
  auto* guard = DataGuard();  // Make sure flag initialized
  (void)guard;
  return OneWordValue().load(std::memory_order_acquire);
}